

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O0

UBool __thiscall
icu_63::FCDUTF8CollationIterator::nextSegment(FCDUTF8CollationIterator *this,UErrorCode *errorCode)

{
  int32_t iVar1;
  UBool UVar2;
  byte bVar3;
  uint16_t uVar4;
  int iVar5;
  int iVar6;
  byte local_86;
  uint8_t __t_1;
  uint8_t leadCC;
  byte local_75;
  uint local_74;
  uint16_t fcd16;
  uint8_t __t;
  UChar32 c;
  int32_t cpStart;
  uint8_t prevCC;
  UnicodeString s;
  int32_t segmentStart;
  UErrorCode *errorCode_local;
  FCDUTF8CollationIterator *this_local;
  
  UVar2 = ::U_FAILURE(*errorCode);
  if (UVar2 != '\0') {
    return '\0';
  }
  s.fUnion._52_4_ = (this->super_UTF8CollationIterator).pos;
  UnicodeString::UnicodeString((UnicodeString *)&cpStart);
  c._3_1_ = 0;
LAB_002943f3:
  iVar6 = (this->super_UTF8CollationIterator).pos;
  iVar5 = (this->super_UTF8CollationIterator).pos;
  (this->super_UTF8CollationIterator).pos = iVar5 + 1;
  bVar3 = (this->super_UTF8CollationIterator).u8[iVar5];
  local_74 = (uint)bVar3;
  if ((bVar3 & 0x80) != 0) {
    if ((this->super_UTF8CollationIterator).pos != (this->super_UTF8CollationIterator).length) {
      if (local_74 < 0xe0) {
        if (0xc1 < local_74) {
          local_74 = local_74 & 0x1f;
LAB_002945d2:
          bVar3 = (this->super_UTF8CollationIterator).u8[(this->super_UTF8CollationIterator).pos] +
                  0x80;
          if (bVar3 < 0x40) {
            local_74 = local_74 << 6 | (uint)bVar3;
            (this->super_UTF8CollationIterator).pos = (this->super_UTF8CollationIterator).pos + 1;
            goto LAB_00294633;
          }
        }
      }
      else if (local_74 < 0xf0) {
        local_74 = local_74 & 0xf;
        local_75 = (this->super_UTF8CollationIterator).u8[(this->super_UTF8CollationIterator).pos];
        if (((int)" 000000000000\x1000"[(int)local_74] & 1 << (sbyte)((int)(uint)local_75 >> 5)) !=
            0) {
          local_75 = local_75 & 0x3f;
LAB_00294589:
          local_74 = local_74 << 6 | (uint)local_75;
          iVar5 = (this->super_UTF8CollationIterator).pos + 1;
          (this->super_UTF8CollationIterator).pos = iVar5;
          if (iVar5 != (this->super_UTF8CollationIterator).length) goto LAB_002945d2;
        }
      }
      else {
        iVar5 = local_74 - 0xf0;
        if ((iVar5 < 5) &&
           (bVar3 = (this->super_UTF8CollationIterator).u8[(this->super_UTF8CollationIterator).pos],
           ((int)""[(int)(uint)bVar3 >> 4] & 1 << ((byte)iVar5 & 0x1f)) != 0)) {
          local_74 = iVar5 * 0x40 | bVar3 & 0x3f;
          iVar5 = (this->super_UTF8CollationIterator).pos + 1;
          (this->super_UTF8CollationIterator).pos = iVar5;
          if ((iVar5 != (this->super_UTF8CollationIterator).length) &&
             (local_75 = (this->super_UTF8CollationIterator).u8
                         [(this->super_UTF8CollationIterator).pos] + 0x80, local_75 < 0x40))
          goto LAB_00294589;
        }
      }
    }
    local_74 = 0xfffd;
  }
LAB_00294633:
  uVar4 = Normalizer2Impl::getFCD16(this->nfcImpl,local_74);
  bVar3 = (byte)(uVar4 >> 8);
  if ((bVar3 != 0) || (iVar6 == s.fUnion._52_4_)) {
    UnicodeString::append((UnicodeString *)&cpStart,local_74);
    if ((bVar3 != 0) &&
       ((bVar3 < c._3_1_ ||
        (UVar2 = CollationFCD::isFCD16OfTibetanCompositeVowel(uVar4), UVar2 != '\0'))))
    goto LAB_002946ef;
    c._3_1_ = (byte)uVar4;
    if (((this->super_UTF8CollationIterator).pos == (this->super_UTF8CollationIterator).length) ||
       (c._3_1_ == 0)) goto LAB_00294a42;
    goto LAB_002943f3;
  }
  (this->super_UTF8CollationIterator).pos = iVar6;
LAB_00294a42:
  this->limit = (this->super_UTF8CollationIterator).pos;
  (this->super_UTF8CollationIterator).pos = s.fUnion._52_4_;
  this->state = IN_FCD_SEGMENT;
  this_local._7_1_ = '\x01';
LAB_00294a76:
  UnicodeString::~UnicodeString((UnicodeString *)&cpStart);
  return this_local._7_1_;
LAB_002946ef:
  if ((this->super_UTF8CollationIterator).pos == (this->super_UTF8CollationIterator).length)
  goto LAB_0029499d;
  iVar1 = (this->super_UTF8CollationIterator).pos;
  iVar6 = (this->super_UTF8CollationIterator).pos;
  (this->super_UTF8CollationIterator).pos = iVar6 + 1;
  bVar3 = (this->super_UTF8CollationIterator).u8[iVar6];
  local_74 = (uint)bVar3;
  if ((bVar3 & 0x80) != 0) {
    if ((this->super_UTF8CollationIterator).pos != (this->super_UTF8CollationIterator).length) {
      if (local_74 < 0xe0) {
        if (0xc1 < local_74) {
          local_74 = local_74 & 0x1f;
LAB_002948e7:
          bVar3 = (this->super_UTF8CollationIterator).u8[(this->super_UTF8CollationIterator).pos] +
                  0x80;
          if (bVar3 < 0x40) {
            local_74 = local_74 << 6 | (uint)bVar3;
            (this->super_UTF8CollationIterator).pos = (this->super_UTF8CollationIterator).pos + 1;
            goto LAB_00294948;
          }
        }
      }
      else if (local_74 < 0xf0) {
        local_74 = local_74 & 0xf;
        local_86 = (this->super_UTF8CollationIterator).u8[(this->super_UTF8CollationIterator).pos];
        if (((int)" 000000000000\x1000"[(int)local_74] & 1 << (sbyte)((int)(uint)local_86 >> 5)) !=
            0) {
          local_86 = local_86 & 0x3f;
LAB_0029489e:
          local_74 = local_74 << 6 | (uint)local_86;
          iVar6 = (this->super_UTF8CollationIterator).pos + 1;
          (this->super_UTF8CollationIterator).pos = iVar6;
          if (iVar6 != (this->super_UTF8CollationIterator).length) goto LAB_002948e7;
        }
      }
      else {
        iVar6 = local_74 - 0xf0;
        if ((iVar6 < 5) &&
           (bVar3 = (this->super_UTF8CollationIterator).u8[(this->super_UTF8CollationIterator).pos],
           ((int)""[(int)(uint)bVar3 >> 4] & 1 << ((byte)iVar6 & 0x1f)) != 0)) {
          local_74 = iVar6 * 0x40 | bVar3 & 0x3f;
          iVar6 = (this->super_UTF8CollationIterator).pos + 1;
          (this->super_UTF8CollationIterator).pos = iVar6;
          if ((iVar6 != (this->super_UTF8CollationIterator).length) &&
             (local_86 = (this->super_UTF8CollationIterator).u8
                         [(this->super_UTF8CollationIterator).pos] + 0x80, local_86 < 0x40))
          goto LAB_0029489e;
        }
      }
    }
    local_74 = 0xfffd;
  }
LAB_00294948:
  uVar4 = Normalizer2Impl::getFCD16(this->nfcImpl,local_74);
  if (uVar4 < 0x100) {
    (this->super_UTF8CollationIterator).pos = iVar1;
    goto LAB_0029499d;
  }
  UnicodeString::append((UnicodeString *)&cpStart,local_74);
  goto LAB_002946ef;
LAB_0029499d:
  UVar2 = normalize(this,(UnicodeString *)&cpStart,errorCode);
  if (UVar2 == '\0') {
    this_local._7_1_ = '\0';
  }
  else {
    this->start = s.fUnion._52_4_;
    this->limit = (this->super_UTF8CollationIterator).pos;
    this->state = IN_NORMALIZED;
    (this->super_UTF8CollationIterator).pos = 0;
    this_local._7_1_ = '\x01';
  }
  goto LAB_00294a76;
}

Assistant:

UBool
FCDUTF8CollationIterator::nextSegment(UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return FALSE; }
    U_ASSERT(state == CHECK_FWD && pos != length);
    // The input text [start..pos[ passes the FCD check.
    int32_t segmentStart = pos;
    // Collect the characters being checked, in case they need to be normalized.
    UnicodeString s;
    uint8_t prevCC = 0;
    for(;;) {
        // Fetch the next character and its fcd16 value.
        int32_t cpStart = pos;
        UChar32 c;
        U8_NEXT_OR_FFFD(u8, pos, length, c);
        uint16_t fcd16 = nfcImpl.getFCD16(c);
        uint8_t leadCC = (uint8_t)(fcd16 >> 8);
        if(leadCC == 0 && cpStart != segmentStart) {
            // FCD boundary before this character.
            pos = cpStart;
            break;
        }
        s.append(c);
        if(leadCC != 0 && (prevCC > leadCC || CollationFCD::isFCD16OfTibetanCompositeVowel(fcd16))) {
            // Fails FCD check. Find the next FCD boundary and normalize.
            while(pos != length) {
                cpStart = pos;
                U8_NEXT_OR_FFFD(u8, pos, length, c);
                if(nfcImpl.getFCD16(c) <= 0xff) {
                    pos = cpStart;
                    break;
                }
                s.append(c);
            }
            if(!normalize(s, errorCode)) { return FALSE; }
            start = segmentStart;
            limit = pos;
            state = IN_NORMALIZED;
            pos = 0;
            return TRUE;
        }
        prevCC = (uint8_t)fcd16;
        if(pos == length || prevCC == 0) {
            // FCD boundary after the last character.
            break;
        }
    }
    limit = pos;
    pos = segmentStart;
    U_ASSERT(pos != limit);
    state = IN_FCD_SEGMENT;
    return TRUE;
}